

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

uint ZSTD_isFrame(void *buffer,size_t size)

{
  U32 UVar1;
  ulong in_RSI;
  U32 magic;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (in_RSI < 4) {
    local_4 = 0;
  }
  else {
    UVar1 = MEM_readLE32(in_stack_ffffffffffffffd8);
    if (UVar1 == 0xfd2fb528) {
      local_4 = 1;
    }
    else if ((UVar1 & 0xfffffff0) == 0x184d2a50) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

unsigned ZSTD_isFrame(const void* buffer, size_t size)
{
    if (size < ZSTD_frameIdSize) return 0;
    {   U32 const magic = MEM_readLE32(buffer);
        if (magic == ZSTD_MAGICNUMBER) return 1;
        if ((magic & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) return 1;
    }
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(buffer, size)) return 1;
#endif
    return 0;
}